

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

void Assimp::FindMeshCenterTransformed
               (aiMesh *mesh,aiVector3D *out,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  FindAABBTransformed(mesh,min,max,m);
  fVar1 = max->y;
  fVar2 = min->y;
  fVar3 = max->z;
  fVar4 = min->z;
  out->x = (max->x - min->x) * 0.5 + min->x;
  out->y = (fVar1 - fVar2) * 0.5 + fVar2;
  out->z = (fVar3 - fVar4) * 0.5 + fVar4;
  return;
}

Assistant:

void FindMeshCenterTransformed (aiMesh* mesh, aiVector3D& out, aiVector3D& min,
    aiVector3D& max, const aiMatrix4x4& m)
{
    FindAABBTransformed(mesh,min,max,m);
    out = min + (max-min)*(ai_real)0.5;
}